

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_service_client_async_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar4;
  t_type *ptVar5;
  string *psVar6;
  char *local_438;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  allocator local_191;
  string local_190 [8];
  string error_completion_call;
  undefined1 local_168 [6];
  bool is_oneway;
  bool ret_is_void;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_a8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_a0;
  t_function **local_98;
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_90;
  const_iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  undefined1 local_60 [8];
  string protocol_name;
  string name;
  t_service *tservice_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  if ((this->gen_cocoa_ & 1U) == 0) {
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&protocol_name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2),"AsyncClient");
    iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2),"Async");
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"extension ");
    poVar3 = std::operator<<(poVar3,(string *)(protocol_name.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3," : ");
    std::operator<<(poVar3,(string *)local_60);
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    __x = t_service::get_functions(tservice);
    std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
              ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::__normal_iterator(&local_90);
    local_a0._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    __gnu_cxx::
    __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
    __normal_iterator<t_function**>
              ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
                *)&local_98,&local_a0);
    local_90._M_current = local_98;
    while( true ) {
      local_a8._M_current =
           (t_function **)
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
      bVar1 = __gnu_cxx::operator!=(&local_90,&local_a8);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      generate_swift_service_client_send_function_implementation(this,out,tservice,*pptVar4,true);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      bVar1 = t_function::is_oneway(*pptVar4);
      if (!bVar1) {
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_90);
        generate_swift_service_client_recv_function_implementation(this,out,tservice,*pptVar4,true);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"public ");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      async_function_signature_abi_cxx11_(&local_c8,this,*pptVar4);
      std::operator<<(poVar3,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      block_open(this,out);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_e8);
      poVar3 = std::operator<<(poVar3,"let transport   = factory.newTransport()");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
      poVar3 = std::operator<<(poVar3,(string *)&local_108);
      poVar3 = std::operator<<(poVar3,"let proto = Protocol(on: transport)");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_128);
      std::operator<<(poVar3,"do");
      std::__cxx11::string::~string((string *)&local_128);
      block_open(this,out);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      generate_swift_service_client_send_async_function_invocation(this,out,*pptVar4);
      t_generator::indent_down((t_generator *)this);
      t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_148);
      poVar3 = std::operator<<(poVar3,"} catch let error {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_148);
      t_generator::indent_up((t_generator *)this);
      t_generator::indent_abi_cxx11_((string *)local_168,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)local_168);
      poVar3 = std::operator<<(poVar3,"completion(.error(error))");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_168);
      block_close(this,out,true);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      ptVar5 = t_function::get_returntype(*pptVar4);
      iVar2 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])();
      error_completion_call.field_2._M_local_buf[0xf] = (byte)iVar2 & 1;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                ::operator*(&local_90);
      error_completion_call.field_2._M_local_buf[0xe] = t_function::is_oneway(*pptVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_190,"completion(.error(error))",&local_191);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar3,"transport.flush");
      block_open(this,out);
      t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_1b8);
      poVar3 = std::operator<<(poVar3,"(trans, error) in");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1b8);
      t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_1d8);
      std::operator<<(poVar3,"if let error = error");
      std::__cxx11::string::~string((string *)&local_1d8);
      block_open(this,out);
      t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_1f8);
      poVar3 = std::operator<<(poVar3,local_190);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1f8);
      block_close(this,out,true);
      if ((error_completion_call.field_2._M_local_buf[0xe] & 1U) == 0) {
        t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_218);
        std::operator<<(poVar3,"do");
        std::__cxx11::string::~string((string *)&local_218);
        block_open(this,out);
        t_generator::indent((t_generator *)this,out);
        if ((error_completion_call.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::operator<<(out,"let result = ");
        }
        poVar3 = std::operator<<(out,"try self.recv_");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  ::operator*(&local_90);
        psVar6 = t_function::get_name_abi_cxx11_(*pptVar4);
        poVar3 = std::operator<<(poVar3,(string *)psVar6);
        poVar3 = std::operator<<(poVar3,"(on: proto)");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_238);
        if ((error_completion_call.field_2._M_local_buf[0xf] & 1U) == 0) {
          local_438 = "completion(.success(result))";
        }
        else {
          local_438 = "completion(.success(Void()))";
        }
        poVar3 = std::operator<<(poVar3,local_438);
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_238);
        t_generator::indent_down((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_258);
        poVar3 = std::operator<<(poVar3,"} catch let error {");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_258);
        t_generator::indent_up((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_278);
        poVar3 = std::operator<<(poVar3,local_190);
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_278);
        block_close(this,out,true);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_298);
        poVar3 = std::operator<<(poVar3,"completion(.success(Void()))");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_298);
      }
      block_close(this,out,true);
      block_close(this,out,true);
      std::__cxx11::string::~string(local_190);
      __gnu_cxx::
      __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
      ::operator++(&local_90);
    }
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
              ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(protocol_name.field_2._M_local_buf + 8));
  }
  else {
    generate_old_swift_service_client_async_implementation(this,out,tservice);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_async_implementation(ostream& out, t_service* tservice) {
  if (gen_cocoa_) {
    generate_old_swift_service_client_async_implementation(out, tservice);
    return;
  }
  string name = tservice->get_name() + "AsyncClient";
  string protocol_name = tservice->get_name() + "Async";

  indent(out) << "extension " << name << " : " << protocol_name;
  block_open(out);
  out << endl;

  // generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {

    generate_swift_service_client_send_function_implementation(out, tservice, *f_iter, true);

    if (!(*f_iter)->is_oneway()) {
      generate_swift_service_client_recv_function_implementation(out, tservice, *f_iter, true);
    }

    indent(out) << "public " << async_function_signature(*f_iter);
    block_open(out);
    out << endl;
    out << indent() << "let transport   = factory.newTransport()" << endl
        << indent() << "let proto = Protocol(on: transport)" << endl
        << endl;

    out << indent() << "do";
    block_open(out);

    generate_swift_service_client_send_async_function_invocation(out, *f_iter);

    indent_down();
    out << indent() << "} catch let error {" << endl;
    indent_up();
    out << indent() << "completion(.error(error))" << endl;
    block_close(out);

    out << endl;

    bool ret_is_void = (*f_iter)->get_returntype()->is_void();
    bool is_oneway = (*f_iter)->is_oneway();

    string error_completion_call = "completion(.error(error))";
    indent(out) << "transport.flush";
    block_open(out);
    out << indent() << "(trans, error) in" << endl << endl;
    out << indent() << "if let error = error";
    block_open(out);
    out << indent() << error_completion_call << endl;
    block_close(out);

    if (!is_oneway) {
      out << indent() << "do";
      block_open(out);
      indent(out);
      if (!ret_is_void) {
        out << "let result = ";
      }
      out << "try self.recv_" << (*f_iter)->get_name() << "(on: proto)" << endl;

      out << indent() << (ret_is_void ? "completion(.success(Void()))" : "completion(.success(result))") << endl;
      indent_down();
      out << indent() << "} catch let error {" << endl;
      indent_up();
      out << indent() << error_completion_call << endl;

      block_close(out);
    } else {
      out << indent() << "completion(.success(Void()))" << endl;
    }
    block_close(out);
    block_close(out);

  }
  block_close(out);
  out << endl;
}